

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_softlocks.hpp
# Opt level: O0

void PatchFixSoftlocks::fix_reverse_greenmaze_fountain_softlock(World *world)

{
  Entity *pEVar1;
  Map *pMVar2;
  Attributes local_e0;
  Entity *local_90;
  Entity *platform_2;
  Attributes local_78;
  Entity *local_28;
  Entity *platform_1;
  Flag is_mercator_fountain_open;
  World *world_local;
  
  is_mercator_fountain_open._8_8_ = world;
  Flag::Flag((Flag *)&platform_1,0xe,'\x01');
  pEVar1 = (Entity *)operator_new(0x58);
  platform_2._3_1_ = 1;
  local_78.type_id = '\x15';
  Position::Position(&local_78.position,'\x15','\x16','\0',false,false,false);
  local_78.orientation = '\0';
  local_78.palette = '\x02';
  local_78.speed = '\0';
  local_78.fightable = false;
  local_78.liftable = false;
  local_78.can_pass_through = false;
  local_78.appear_after_player_moved_away = false;
  local_78.gravity_immune = false;
  local_78.talkable = false;
  local_78.dialogue = '\0';
  local_78.behavior_id = 0;
  local_78.entity_to_use_tiles_from = (Entity *)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_78.mask_flags);
  Flag::Flag(&local_78.persistence_flag,0xff,0xff);
  local_78.flag_unknown_2_3 = false;
  local_78.flag_unknown_2_4 = false;
  local_78.flag_unknown_3_5 = false;
  Entity::Entity(pEVar1,&local_78);
  platform_2._3_1_ = 0;
  Entity::Attributes::~Attributes(&local_78);
  local_28 = pEVar1;
  Entity::remove_when_flag_is_set(pEVar1,(Flag *)&platform_1);
  pEVar1 = (Entity *)operator_new(0x58);
  local_e0.type_id = '\x15';
  Position::Position(&local_e0.position,'\x15','\x17','\0',false,false,false);
  local_e0.orientation = '\0';
  local_e0.palette = '\x02';
  local_e0.speed = '\0';
  local_e0.fightable = false;
  local_e0.liftable = false;
  local_e0.can_pass_through = false;
  local_e0.appear_after_player_moved_away = false;
  local_e0.gravity_immune = false;
  local_e0.talkable = false;
  local_e0.dialogue = '\0';
  local_e0.behavior_id = 0;
  local_e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_e0.mask_flags);
  Flag::Flag(&local_e0.persistence_flag,0xff,0xff);
  local_e0.flag_unknown_2_3 = false;
  local_e0.flag_unknown_2_4 = false;
  local_e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar1,&local_e0);
  Entity::Attributes::~Attributes(&local_e0);
  local_90 = pEVar1;
  Entity::remove_when_flag_is_set(pEVar1,(Flag *)&platform_1);
  pMVar2 = World::map((World *)is_mercator_fountain_open._8_8_,0x1cc);
  Map::add_entity(pMVar2,local_28);
  pMVar2 = World::map((World *)is_mercator_fountain_open._8_8_,0x1cc);
  Map::add_entity(pMVar2,local_90);
  return;
}

Assistant:

static void fix_reverse_greenmaze_fountain_softlock(World& world)
    {
        Flag is_mercator_fountain_open(0xE, 1);

        Entity* platform_1 = new Entity({
                .type_id = ENTITY_SMALL_YELLOW_PLATFORM,
                .position = Position(21, 22, 0, false, false, false),
                .palette = 2
        });
        platform_1->remove_when_flag_is_set(is_mercator_fountain_open);

        Entity* platform_2 = new Entity({
                .type_id = ENTITY_SMALL_YELLOW_PLATFORM,
                .position = Position(21, 23, 0, false, false, false),
                .palette = 2
        });
        platform_2->remove_when_flag_is_set(is_mercator_fountain_open);

        world.map(MAP_460)->add_entity(platform_1);
        world.map(MAP_460)->add_entity(platform_2);
    }